

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFParser.cpp
# Opt level: O2

PDFObjectParser * __thiscall
PDFParser::StartReadingObjectsFromStream(PDFParser *this,PDFStreamInput *inStream)

{
  IByteReader *inSourceStream;
  PDFObjectParser *this_00;
  InputStreamSkipperStream *this_01;
  
  inSourceStream = StartReadingFromStream(this,inStream);
  if (inSourceStream == (IByteReader *)0x0) {
    this_00 = (PDFObjectParser *)0x0;
  }
  else {
    this_00 = (PDFObjectParser *)operator_new(0x60);
    PDFObjectParser::PDFObjectParser(this_00);
    this_01 = (InputStreamSkipperStream *)operator_new(0x20);
    InputStreamSkipperStream::InputStreamSkipperStream(this_01,inSourceStream);
    PDFObjectParser::SetReadStream
              (this_00,(IByteReader *)this_01,&this_01->super_IReadPositionProvider,true);
    PDFObjectParser::SetParserExtender(this_00,this->mParserExtender);
  }
  return this_00;
}

Assistant:

PDFObjectParser* PDFParser::StartReadingObjectsFromStream(PDFStreamInput* inStream) {
	IByteReader* readStream = StartReadingFromStream(inStream);
	if(!readStream)
		return NULL;

	PDFObjectParser* objectsParser = new PDFObjectParser();
	InputStreamSkipperStream* source = new InputStreamSkipperStream(readStream);
	objectsParser->SetReadStream(source,source,true);
	// Not setting decryption filter cause shuoldnt decrypt at lower level. if at all - the stream is encrypted already
	objectsParser->SetParserExtender(mParserExtender);

	return objectsParser;
}